

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_new_token_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  uint8_t *puVar1;
  st_quicly_save_resumption_token_t *psVar2;
  int iVar3;
  uint64_t uVar4;
  ptls_iovec_t pVar5;
  
  end = state->end;
  uVar4 = ptls_decode_quicint(&state->src,end);
  iVar3 = 0x20007;
  if ((1 < uVar4 + 1) && (puVar1 = state->src, uVar4 <= (ulong)((long)end - (long)puVar1))) {
    state->src = puVar1 + uVar4;
    if (quicly_trace_fp != (FILE *)0x0) {
      handle_new_token_frame_cold_1();
    }
    psVar2 = ((conn->super).ctx)->save_resumption_token;
    if (psVar2 != (st_quicly_save_resumption_token_t *)0x0) {
      pVar5.len = uVar4;
      pVar5.base = puVar1;
      iVar3 = (*psVar2->cb)(psVar2,conn,pVar5);
      return iVar3;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int handle_new_token_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_new_token_frame_t frame;
    int ret;

    if ((ret = quicly_decode_new_token_frame(&state->src, state->end, &frame)) != 0)
        return ret;
    QUICLY_PROBE(NEW_TOKEN_RECEIVE, conn, conn->stash.now, frame.token.base, frame.token.len);
    if (conn->super.ctx->save_resumption_token == NULL)
        return 0;
    return conn->super.ctx->save_resumption_token->cb(conn->super.ctx->save_resumption_token, conn, frame.token);
}